

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

Curl_easy * Curl_multi_get_handle(Curl_multi *multi,curl_off_t mid)

{
  Curl_easy *pCVar1;
  Curl_llist_node *local_30;
  Curl_llist_node *e;
  Curl_easy *data;
  curl_off_t mid_local;
  Curl_multi *multi_local;
  
  if (-1 < mid) {
    for (local_30 = Curl_llist_head(&multi->process); local_30 != (Curl_llist_node *)0x0;
        local_30 = Curl_node_next(local_30)) {
      pCVar1 = (Curl_easy *)Curl_node_elem(local_30);
      if (pCVar1->mid == mid) {
        return pCVar1;
      }
    }
    for (local_30 = Curl_llist_head(&multi->msgsent); local_30 != (Curl_llist_node *)0x0;
        local_30 = Curl_node_next(local_30)) {
      pCVar1 = (Curl_easy *)Curl_node_elem(local_30);
      if (pCVar1->mid == mid) {
        return pCVar1;
      }
    }
    for (local_30 = Curl_llist_head(&multi->pending); local_30 != (Curl_llist_node *)0x0;
        local_30 = Curl_node_next(local_30)) {
      pCVar1 = (Curl_easy *)Curl_node_elem(local_30);
      if (pCVar1->mid == mid) {
        return pCVar1;
      }
    }
  }
  return (Curl_easy *)0x0;
}

Assistant:

struct Curl_easy *Curl_multi_get_handle(struct Curl_multi *multi,
                                        curl_off_t mid)
{

  if(mid >= 0) {
    struct Curl_easy *data;
    struct Curl_llist_node *e;

    for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
    /* may be in msgsent queue */
    for(e = Curl_llist_head(&multi->msgsent); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
    /* may be in pending queue */
    for(e = Curl_llist_head(&multi->pending); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
  }
  return NULL;
}